

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

ON_Locale * ON_Locale::FromWindowsName(ON_Locale *__return_storage_ptr__,char *locale_name)

{
  bool bVar1;
  char *pcVar2;
  ON_String local_a0;
  ON_String cleaned_loc;
  char windows_sortorder [32];
  char region_subtag [32];
  char script_subtag [32];
  char language_subtag [32];
  char *locale_name_local;
  
  if ((locale_name == (char *)0x0) || (*locale_name == '\0')) {
    memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
  }
  else if ((*locale_name == 'C') && (locale_name[1] == '\0')) {
    memcpy(__return_storage_ptr__,&Ordinal,0xa0);
  }
  else {
    memset(script_subtag + 0x18,0,0x20);
    memset(region_subtag + 0x18,0,0x20);
    memset(windows_sortorder + 0x18,0,0x20);
    memset(&cleaned_loc,0,0x20);
    bVar1 = ParseName(locale_name,-1,script_subtag + 0x18,0x20,(char *)0x0,0,region_subtag + 0x18,
                      0x20,windows_sortorder + 0x18,0x20,(char *)&cleaned_loc,0x20);
    if (bVar1) {
      if (script_subtag[0x18] == '\0') {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                   ,0x40c,"","ParseLocaleName() returned empty language name.");
        memcpy(__return_storage_ptr__,&Ordinal,0xa0);
      }
      else if (script_subtag[0x19] == '\0') {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                   ,0x412,"","ParseLocaleName() returned invalid language name.");
        memcpy(__return_storage_ptr__,&Ordinal,0xa0);
      }
      else {
        bVar1 = ON_String::EqualOrdinal("zh",-1,script_subtag + 0x18,-1,true);
        if (bVar1) {
          bVar1 = ON_String::EqualOrdinal("Hans",-1,region_subtag + 0x18,-1,true);
          if (bVar1) {
            FromWindowsLCIDAndName(__return_storage_ptr__,0x804,"zh-CN");
          }
          else {
            bVar1 = ON_String::EqualOrdinal("Hant",-1,region_subtag + 0x18,-1,true);
            if (bVar1) {
              FromWindowsLCIDAndName(__return_storage_ptr__,0x404,"zh-TW");
            }
            else {
              bVar1 = ON_String::EqualOrdinal("CN",-1,windows_sortorder + 0x18,-1,true);
              if (bVar1) {
                FromWindowsLCIDAndName(__return_storage_ptr__,0x804,"zh-CN");
              }
              else {
                bVar1 = ON_String::EqualOrdinal("TW",-1,windows_sortorder + 0x18,-1,true);
                if (bVar1) {
                  FromWindowsLCIDAndName(__return_storage_ptr__,0x404,"zh-TW");
                }
                else {
                  FromWindowsLCIDAndName(__return_storage_ptr__,0x404,"zh-TW");
                }
              }
            }
          }
        }
        else {
          ON_String::ON_String(&local_a0,script_subtag + 0x18);
          ON_String::operator+=(&local_a0,'-');
          ON_String::operator+=(&local_a0,windows_sortorder + 0x18);
          if ((char)cleaned_loc.m_s != '\0') {
            ON_String::operator+=(&local_a0,'_');
            ON_String::operator+=(&local_a0,(char *)&cleaned_loc);
          }
          pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
          bVar1 = ON_String::EqualOrdinal("cs-CZ",-1,pcVar2,-1,true);
          if (bVar1) {
            FromWindowsLCIDAndName(__return_storage_ptr__,0x405,"cs-CZ");
            bVar1 = true;
          }
          else {
            pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
            bVar1 = ON_String::EqualOrdinal("de-DE",-1,pcVar2,-1,true);
            if (bVar1) {
              FromWindowsLCIDAndName(__return_storage_ptr__,0x407,"de-DE");
              bVar1 = true;
            }
            else {
              pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
              bVar1 = ON_String::EqualOrdinal("en-US",-1,pcVar2,-1,true);
              if (bVar1) {
                FromWindowsLCIDAndName(__return_storage_ptr__,0x409,"en-US");
                bVar1 = true;
              }
              else {
                pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                bVar1 = ON_String::EqualOrdinal("es-ES_tradnl",-1,pcVar2,-1,true);
                if (bVar1) {
                  FromWindowsLCIDAndName(__return_storage_ptr__,0x40a,"es-ES_tradnl");
                  bVar1 = true;
                }
                else {
                  pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                  bVar1 = ON_String::EqualOrdinal("es-ES",-1,pcVar2,-1,true);
                  if (bVar1) {
                    FromWindowsLCIDAndName(__return_storage_ptr__,0xc0a,"es-ES");
                    bVar1 = true;
                  }
                  else {
                    pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                    bVar1 = ON_String::EqualOrdinal("fr-FR",-1,pcVar2,-1,true);
                    if (bVar1) {
                      FromWindowsLCIDAndName(__return_storage_ptr__,0x40c,"fr-FR");
                      bVar1 = true;
                    }
                    else {
                      pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                      bVar1 = ON_String::EqualOrdinal("it-IT",-1,pcVar2,-1,true);
                      if (bVar1) {
                        FromWindowsLCIDAndName(__return_storage_ptr__,0x410,"it-IT");
                        bVar1 = true;
                      }
                      else {
                        pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                        bVar1 = ON_String::EqualOrdinal("ja-JP",-1,pcVar2,-1,true);
                        if (bVar1) {
                          FromWindowsLCIDAndName(__return_storage_ptr__,0x411,"ja-JP");
                          bVar1 = true;
                        }
                        else {
                          pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                          bVar1 = ON_String::EqualOrdinal("ko-KR",-1,pcVar2,-1,true);
                          if (bVar1) {
                            FromWindowsLCIDAndName(__return_storage_ptr__,0x412,"ko-KR");
                            bVar1 = true;
                          }
                          else {
                            pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                            bVar1 = ON_String::EqualOrdinal("pl-PL",-1,pcVar2,-1,true);
                            if (bVar1) {
                              FromWindowsLCIDAndName(__return_storage_ptr__,0x415,"pl-PL");
                              bVar1 = true;
                            }
                            else {
                              pcVar2 = ON_String::operator_cast_to_char_(&local_a0);
                              bVar1 = ON_String::EqualOrdinal("pt-PT",-1,pcVar2,-1,true);
                              if (bVar1) {
                                FromWindowsLCIDAndName(__return_storage_ptr__,0x816,"pt-PT");
                                bVar1 = true;
                              }
                              else {
                                bVar1 = ON_String::EqualOrdinal
                                                  ("cs",-1,script_subtag + 0x18,-1,true);
                                if (bVar1) {
                                  FromWindowsLCIDAndName(__return_storage_ptr__,0x405,"cs-CZ");
                                  bVar1 = true;
                                }
                                else {
                                  bVar1 = ON_String::EqualOrdinal
                                                    ("de",-1,script_subtag + 0x18,-1,true);
                                  if (bVar1) {
                                    FromWindowsLCIDAndName(__return_storage_ptr__,0x407,"de-DE");
                                    bVar1 = true;
                                  }
                                  else {
                                    bVar1 = ON_String::EqualOrdinal
                                                      ("en",-1,script_subtag + 0x18,-1,true);
                                    if (bVar1) {
                                      FromWindowsLCIDAndName(__return_storage_ptr__,0x409,"en-US");
                                      bVar1 = true;
                                    }
                                    else {
                                      bVar1 = ON_String::EqualOrdinal
                                                        ("es",-1,script_subtag + 0x18,-1,true);
                                      if (bVar1) {
                                        FromWindowsLCIDAndName(__return_storage_ptr__,0xc0a,"es-ES")
                                        ;
                                        bVar1 = true;
                                      }
                                      else {
                                        bVar1 = ON_String::EqualOrdinal
                                                          ("fr",-1,script_subtag + 0x18,-1,true);
                                        if (bVar1) {
                                          FromWindowsLCIDAndName
                                                    (__return_storage_ptr__,0x40c,"fr-FR");
                                          bVar1 = true;
                                        }
                                        else {
                                          bVar1 = ON_String::EqualOrdinal
                                                            ("it",-1,script_subtag + 0x18,-1,true);
                                          if (bVar1) {
                                            FromWindowsLCIDAndName
                                                      (__return_storage_ptr__,0x410,"it-IT");
                                            bVar1 = true;
                                          }
                                          else {
                                            bVar1 = ON_String::EqualOrdinal
                                                              ("ja",-1,script_subtag + 0x18,-1,true)
                                            ;
                                            if (bVar1) {
                                              FromWindowsLCIDAndName
                                                        (__return_storage_ptr__,0x411,"ja-JP");
                                              bVar1 = true;
                                            }
                                            else {
                                              bVar1 = ON_String::EqualOrdinal
                                                                ("ko",-1,script_subtag + 0x18,-1,
                                                                 true);
                                              if (bVar1) {
                                                FromWindowsLCIDAndName
                                                          (__return_storage_ptr__,0x412,"ko-KR");
                                                bVar1 = true;
                                              }
                                              else {
                                                bVar1 = ON_String::EqualOrdinal
                                                                  ("pl",-1,script_subtag + 0x18,-1,
                                                                   true);
                                                if (bVar1) {
                                                  FromWindowsLCIDAndName
                                                            (__return_storage_ptr__,0x415,"pl-PL");
                                                  bVar1 = true;
                                                }
                                                else {
                                                  bVar1 = ON_String::EqualOrdinal
                                                                    ("pt",-1,script_subtag + 0x18,-1
                                                                     ,true);
                                                  if (bVar1) {
                                                    FromWindowsLCIDAndName
                                                              (__return_storage_ptr__,0x816,"pt-PT")
                                                    ;
                                                    bVar1 = true;
                                                  }
                                                  else {
                                                    bVar1 = false;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          ON_String::~ON_String(&local_a0);
          if (!bVar1) {
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                       ,0x459,"","Unsupported language name.");
            memcpy(__return_storage_ptr__,&InvariantCulture,0xa0);
          }
        }
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_locale.cpp"
                 ,0x406,"","ParseLocaleName() failed.");
      memcpy(__return_storage_ptr__,&Ordinal,0xa0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Locale ON_Locale::FromWindowsName(
    const char* locale_name
    )
{
  if (0 == locale_name || 0 == locale_name[0])
    return ON_Locale::InvariantCulture;

  if ('C' == locale_name[0] && 0 == locale_name[1] )
    return ON_Locale::Ordinal;

#if defined(ON_RUNTIME_WIN)

  const ON_wString buffer1(locale_name);
  const wchar_t* wlocale_name = static_cast< const wchar_t* >(buffer1);
  wchar_t buffer2[LOCALE_NAME_MAX_LENGTH] = { 0 };

  if (false == ::IsValidLocaleName(wlocale_name))
  {
    const int buffer2_capacity = (int)(sizeof(buffer2) / sizeof(buffer2[0]));
    if (0 != ::ResolveLocaleName(wlocale_name,buffer2,buffer2_capacity)
        && ::IsValidLocaleName(buffer2)
      )
    {
      wlocale_name = buffer2;
    }
    else
    {
      return ON_Locale::InvariantCulture;
    }
  }

  LCID windows_lcid = ::LocaleNameToLCID(
    wlocale_name,
    LOCALE_ALLOW_NEUTRAL_NAMES
    );

  if (0 == windows_lcid)
  {
    ON_ERROR("Windows ::LocaleNameToLCID() failed.");
    return ON_Locale::Ordinal;
  }

  char slocale_name[ON_Locale::BUFFER_MAXIMUM_CAPACITY] = { 0 };
  if (false == ASCIIWideToChar(wlocale_name, ON_wString::Length(wlocale_name), slocale_name, sizeof(slocale_name) / sizeof(slocale_name[0])))
  {
    ON_ERROR("locale_name contains invalid values.");
    return ON_Locale::Ordinal;
  }

  return ON_Locale::FromWindowsLCIDAndName(
    (ON__UINT32)windows_lcid,
    slocale_name
    );

#else

  char language_subtag[32] = { 0 };
  char script_subtag[32] = { 0 };
  char region_subtag[32] = { 0 };
  char windows_sortorder[32] = { 0 };
  if (false == ON_Locale::ParseName(
    locale_name,
    -1,
    language_subtag, sizeof(language_subtag) / sizeof(language_subtag[0]),
    nullptr, 0,
    script_subtag, sizeof(script_subtag) / sizeof(script_subtag[0]),
    region_subtag, sizeof(region_subtag) / sizeof(region_subtag[0]),
    windows_sortorder, sizeof(windows_sortorder) / sizeof(windows_sortorder[0])
    ))
  {
    ON_ERROR("ParseLocaleName() failed.");
    return ON_Locale::Ordinal;
  }

  if (0 == language_subtag[0])
  {
    ON_ERROR("ParseLocaleName() returned empty language name.");
    return ON_Locale::Ordinal;
  }

  if (0 == language_subtag[1])
  {
    ON_ERROR("ParseLocaleName() returned invalid language name.");
    return ON_Locale::Ordinal;
  }

  if ( ON_String::EqualOrdinal("zh", -1, language_subtag, -1, true) )
  {
    // Rhino supports two Chinese locales.
    if (ON_String::EqualOrdinal("Hans", -1, script_subtag, -1, true))
    {
      // Apple uses "zh-Hans" to mean BCP 47 "zh-CN"
      // January 26, 2024 - Tim
      // I don't think we should fail if the region is not set to China, "zh-Hans" is sufficient to choose "zh-CN"
      //if ( 0 == region_subtag[0] || ON_String::EqualOrdinal("CN", -1, region_subtag, -1, true) )
        return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_CN_LCID, "zh-CN" );
    }
    else if (ON_String::EqualOrdinal("Hant", -1, script_subtag, -1, true))
    {
      // Apple uses "zh-Hant" to mean BCP 47 "zh-CN"
      // January 26, 2024 - Tim
      // I don't think we should fail if the region is not set to Taiwan, "zh-Hant" is sufficient to choose "zh-TW"
      //if ( 0 == region_subtag[0] || ON_String::EqualOrdinal("TW", -1, region_subtag, -1, true) )
        return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_TW_LCID, "zh-TW" );
    }
    else if ( ON_String::EqualOrdinal("CN", -1, region_subtag, -1, true) )
      return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_CN_LCID, "zh-CN" );
    else if ( ON_String::EqualOrdinal("TW", -1, region_subtag, -1, true) )
      return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_TW_LCID, "zh-TW" );
    else
      return ON_Locale::FromWindowsLCIDAndName(ON_Locale::zh_TW_LCID, "zh-TW" );
  }
  else
  {
    // Rhino supports a single region and default script for these languages.
    ON_String cleaned_loc = language_subtag;
    cleaned_loc += '-';
    cleaned_loc +=region_subtag;
    if ( 0 != windows_sortorder[0])
    {
      cleaned_loc += '_';
      cleaned_loc += windows_sortorder;
    }
    
#define LANG_CASE(lcid,lang) if (ON_String::EqualOrdinal(lang, -1, cleaned_loc, -1, true)) return ON_Locale::FromWindowsLCIDAndName(lcid, lang )
    LANG_CASE( ON_Locale::cs_CZ_LCID, "cs-CZ" );
    LANG_CASE( ON_Locale::de_DE_LCID, "de-DE" );
    LANG_CASE( ON_Locale::en_US_LCID, "en-US" );
    LANG_CASE( ON_Locale::es_ES_tradnl_LCID, "es-ES_tradnl" ); // _tradnl is Windows sort order
    LANG_CASE( ON_Locale::es_ES_LCID, "es-ES" );
    LANG_CASE( ON_Locale::fr_FR_LCID, "fr-FR" );
    LANG_CASE( ON_Locale::it_IT_LCID, "it-IT" );
    LANG_CASE( ON_Locale::ja_JP_LCID, "ja-JP" );
    LANG_CASE( ON_Locale::ko_KR_LCID, "ko-KR" );
    LANG_CASE( ON_Locale::pl_PL_LCID, "pl-PL" );
    LANG_CASE( ON_Locale::pt_PT_LCID, "pt-PT" );
#undef LANG_CASE
    
    // Bail out clause to handle string like fr-US.
#define LANG_CASE_2(two_letter_lang_code,lcid,lang) if (ON_String::EqualOrdinal(two_letter_lang_code, -1, language_subtag, -1, true)) return ON_Locale::FromWindowsLCIDAndName(lcid, lang )
    LANG_CASE_2( "cs", ON_Locale::cs_CZ_LCID, "cs-CZ" );
    LANG_CASE_2( "de", ON_Locale::de_DE_LCID, "de-DE" );
    LANG_CASE_2( "en", ON_Locale::en_US_LCID, "en-US" );
    LANG_CASE_2( "es", ON_Locale::es_ES_LCID, "es-ES" );
    LANG_CASE_2( "fr", ON_Locale::fr_FR_LCID, "fr-FR" );
    LANG_CASE_2( "it", ON_Locale::it_IT_LCID, "it-IT" );
    LANG_CASE_2( "ja", ON_Locale::ja_JP_LCID, "ja-JP" );
    LANG_CASE_2( "ko", ON_Locale::ko_KR_LCID, "ko-KR" );
    LANG_CASE_2( "pl", ON_Locale::pl_PL_LCID, "pl-PL" );
    LANG_CASE_2( "pt", ON_Locale::pt_PT_LCID, "pt-PT" );
#undef LANG_CASE_2
  }

  ON_ERROR("Unsupported language name.");
  return ON_Locale::InvariantCulture;

#endif

}